

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

void __thiscall QtMWidgets::BlurEffect::paintEvent(BlurEffect *this,QPaintEvent *param_1)

{
  BlurPolicy BVar1;
  QPainter p;
  QPainter aQStack_18 [8];
  
  QPainter::QPainter(aQStack_18,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)aQStack_18,true);
  BVar1 = this->policy;
  if (BVar1 != BlurBothDirections) {
    if (BVar1 == BlurHorizontalOnly) {
      if (this->orientation != Vertical) goto LAB_0015592a;
    }
    else if ((BVar1 != BlurVerticalOnly) || (this->orientation != Horizontal)) goto LAB_0015592a;
  }
  drawBlur(this,aQStack_18,&this->color);
LAB_0015592a:
  QPainter::~QPainter(aQStack_18);
  return;
}

Assistant:

void
BlurEffect::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );

	switch( policy )
	{
		case AbstractScrollArea::BlurAlwaysOff :
			return;

		case AbstractScrollArea::BlurHorizontalOnly :
		{
			if( orientation == Qt::Vertical )
				drawBlur( &p, color );
		}
			break;

		case AbstractScrollArea::BlurVerticalOnly :
		{
			if( orientation == Qt::Horizontal )
				drawBlur( &p, color );
		}
			break;

		case AbstractScrollArea::BlurBothDirections :
			drawBlur( &p, color );
			break;

		default :
			break;
	}
}